

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  secp256k1_fe *a_00;
  secp256k1_ge *a_01;
  secp256k1_fe *psVar5;
  ulong uVar6;
  secp256k1_gej *a_02;
  secp256k1_gej *psVar7;
  ulong uVar8;
  secp256k1_gej *a_03;
  secp256k1_fe *psVar9;
  secp256k1_ge *a_04;
  size_t sVar10;
  secp256k1_fe *b;
  secp256k1_fe zs;
  secp256k1_fe zi2;
  secp256k1_fe sStack_170;
  secp256k1_fe sStack_140;
  secp256k1_ge *psStack_110;
  secp256k1_ge *psStack_108;
  secp256k1_fe *psStack_100;
  secp256k1_gej *psStack_f8;
  secp256k1_fe *psStack_f0;
  secp256k1_ge *local_e0;
  size_t local_d8;
  secp256k1_fe *local_d0;
  secp256k1_gej local_c8;
  
  psVar9 = zr;
  local_e0 = a;
  local_d8 = len;
  if (len != 0) {
    do {
      psStack_f0 = (secp256k1_fe *)0x11c756;
      secp256k1_ge_verify(a);
      psStack_f0 = (secp256k1_fe *)0x11c75e;
      secp256k1_fe_verify(psVar9);
      sVar10 = local_d8;
      a_01 = local_e0;
      a = a + 1;
      len = len - 1;
      psVar9 = psVar9 + 1;
    } while (len != 0);
    psVar9 = (secp256k1_fe *)(local_d8 - 1);
    psVar5 = &local_e0[(long)psVar9].y;
    psStack_f0 = (secp256k1_fe *)0x11c78d;
    secp256k1_fe_verify(psVar5);
    uVar2 = a_01[(long)psVar9].y.n[4];
    uVar4 = (uVar2 >> 0x30) * 0x1000003d1 + psVar5->n[0];
    uVar3 = (uVar4 >> 0x34) + a_01[(long)psVar9].y.n[1];
    uVar6 = (uVar3 >> 0x34) + a_01[(long)psVar9].y.n[2];
    uVar8 = (uVar6 >> 0x34) + a_01[(long)psVar9].y.n[3];
    a_02 = (secp256k1_gej *)(uVar6 & 0xfffffffffffff);
    psVar5->n[0] = uVar4 & 0xfffffffffffff;
    a_01[(long)psVar9].y.n[1] = uVar3 & 0xfffffffffffff;
    a_01[(long)psVar9].y.n[2] = (uint64_t)a_02;
    a_01[(long)psVar9].y.n[3] = uVar8 & 0xfffffffffffff;
    a_01[(long)psVar9].y.n[4] = (uVar8 >> 0x34) + (uVar2 & 0xffffffffffff);
    a_01[(long)psVar9].y.magnitude = 1;
    psStack_f0 = (secp256k1_fe *)0x11c822;
    secp256k1_fe_verify(psVar5);
    local_c8.x.n[0] = zr[(long)psVar9].n[0];
    local_c8.x.n[1] = zr[(long)psVar9].n[1];
    local_c8.x.n[2] = zr[(long)psVar9].n[2];
    local_c8.x.n[3] = (zr[(long)psVar9].n + 2)[1];
    local_c8.x.n[4] = zr[(long)psVar9].n[4];
    local_c8.x._40_8_ = (zr[(long)psVar9].n + 4)[1];
    local_d0 = psVar9;
    if (psVar9 != (secp256k1_fe *)0x0) {
      a_04 = a_01 + (sVar10 - 2);
      b = zr + sVar10;
      psVar5 = (secp256k1_fe *)0x0;
      do {
        b = b + -1;
        if (psVar5 != (secp256k1_fe *)0x0) {
          psStack_f0 = (secp256k1_fe *)0x11c897;
          a_02 = &local_c8;
          secp256k1_fe_mul(&local_c8.x,&local_c8.x,b);
        }
        psStack_f0 = (secp256k1_fe *)0x11c89f;
        secp256k1_ge_verify(a_04);
        psStack_f0 = (secp256k1_fe *)0x11c8a7;
        a_03 = &local_c8;
        secp256k1_fe_verify(&local_c8.x);
        if (a_04->infinity != 0) {
          psStack_f0 = (secp256k1_fe *)secp256k1_ge_set_gej_zinv;
          secp256k1_ge_table_set_globalz_cold_1();
          psVar7 = a_02;
          psStack_110 = a_01;
          psStack_108 = a_04;
          psStack_100 = psVar9;
          psStack_f8 = &local_c8;
          psStack_f0 = b;
          secp256k1_gej_verify(a_02);
          psVar9 = a_00;
          secp256k1_fe_verify(a_00);
          if (a_02->infinity == 0) {
            secp256k1_fe_sqr(&sStack_140,a_00);
            secp256k1_fe_mul(&sStack_170,&sStack_140,a_00);
            secp256k1_fe_mul(&a_03->x,&a_02->x,&sStack_140);
            secp256k1_fe_mul(&a_03->y,&a_02->y,&sStack_170);
            *(int *)(a_03->z).n = a_02->infinity;
            secp256k1_ge_verify((secp256k1_ge *)a_03);
            return;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          uVar1 = *(uint *)((long)(psVar7->x).n + 0x1c);
          psVar9->n[0] = (ulong)(*(byte *)((long)(psVar7->x).n + 0x19) & 0xf) << 0x30 |
                         (ulong)CONCAT15(*(undefined1 *)((long)(psVar7->x).n + 0x1a),
                                         CONCAT14(*(undefined1 *)((long)(psVar7->x).n + 0x1b),
                                                  uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                  (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
          psVar9->n[1] = (ulong)*(byte *)((long)(psVar7->x).n + 0x13) << 0x2c |
                         (ulong)*(byte *)((long)(psVar7->x).n + 0x14) << 0x24 |
                         (ulong)*(byte *)((long)(psVar7->x).n + 0x15) << 0x1c |
                         (ulong)((uint)*(byte *)((long)(psVar7->x).n + 0x16) << 0x14 |
                                (uint)*(byte *)((long)(psVar7->x).n + 0x17) << 0xc |
                                (uint)(byte)(psVar7->x).n[3] << 4 |
                                (uint)(*(byte *)((long)(psVar7->x).n + 0x19) >> 4));
          uVar1 = *(uint *)((long)(psVar7->x).n + 0xf);
          psVar9->n[2] = (ulong)(*(byte *)((long)(psVar7->x).n + 0xc) & 0xf) << 0x30 |
                         (ulong)CONCAT15(*(undefined1 *)((long)(psVar7->x).n + 0xd),
                                         CONCAT14(*(undefined1 *)((long)(psVar7->x).n + 0xe),
                                                  uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                  (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
          psVar9->n[3] = (ulong)*(byte *)((long)(psVar7->x).n + 6) << 0x2c |
                         (ulong)*(byte *)((long)(psVar7->x).n + 7) << 0x24 |
                         (ulong)(byte)(psVar7->x).n[1] << 0x1c |
                         (ulong)((uint)*(byte *)((long)(psVar7->x).n + 9) << 0x14 |
                                (uint)*(byte *)((long)(psVar7->x).n + 10) << 0xc |
                                (uint)*(byte *)((long)(psVar7->x).n + 0xb) << 4 |
                                (uint)(*(byte *)((long)(psVar7->x).n + 0xc) >> 4));
          uVar1 = *(uint *)((long)(psVar7->x).n + 2);
          psVar9->n[4] = (ulong)CONCAT15((char)(psVar7->x).n[0],
                                         CONCAT14(*(undefined1 *)((long)(psVar7->x).n + 1),
                                                  uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 |
                                                  (uVar1 & 0xff00) << 8 | uVar1 << 0x18));
          return;
        }
        psVar9 = (secp256k1_fe *)(local_c8.z.n + 1);
        psStack_f0 = (secp256k1_fe *)0x11c8c6;
        secp256k1_fe_sqr(psVar9,&local_c8.x);
        a_01 = (secp256k1_ge *)(local_c8.y.n + 1);
        psStack_f0 = (secp256k1_fe *)0x11c8d9;
        secp256k1_fe_mul((secp256k1_fe *)a_01,psVar9,&local_c8.x);
        psStack_f0 = (secp256k1_fe *)0x11c8e7;
        secp256k1_fe_mul(&a_04->x,&a_04->x,psVar9);
        a_02 = (secp256k1_gej *)&a_04->y;
        psStack_f0 = (secp256k1_fe *)0x11c8f7;
        secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)a_01);
        psStack_f0 = (secp256k1_fe *)0x11c8ff;
        secp256k1_ge_verify(a_04);
        psVar5 = (secp256k1_fe *)((long)psVar5->n + 1);
        a_04 = a_04 + -1;
      } while (local_d0 != psVar5);
      a_01 = local_e0;
      sVar10 = local_d8;
      if (local_d8 == 0) {
        return;
      }
    }
    do {
      psStack_f0 = (secp256k1_fe *)0x11c92c;
      secp256k1_ge_verify(a_01);
      a_01 = a_01 + 1;
      sVar10 = sVar10 - 1;
    } while (sVar10 != 0);
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}